

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O3

void fe_mul_impl(fe_limb_t *out,fe_limb_t *in1,fe_limb_t *in2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  long lVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  
  lVar58 = 0;
  do {
    if (0x1a666666666664 < in1[lVar58]) {
      __assert_fail("constant_time_declassify_int(in1[_assert_fe_i] <= 0x1a666666666664UL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xd5,"void fe_mul_impl(fe_limb_t *, const fe_limb_t *, const fe_limb_t *)");
    }
    lVar58 = lVar58 + 1;
  } while (lVar58 != 5);
  lVar58 = 0;
  do {
    if (0x1a666666666664 < in2[lVar58]) {
      __assert_fail("constant_time_declassify_int(in2[_assert_fe_i] <= 0x1a666666666664UL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xd6,"void fe_mul_impl(fe_limb_t *, const fe_limb_t *, const fe_limb_t *)");
    }
    lVar58 = lVar58 + 1;
  } while (lVar58 != 5);
  uVar61 = in1[4];
  uVar3 = in2[4] * 0x13;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar3;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar61;
  uVar59 = in2[3];
  uVar2 = uVar59 * 0x13;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar61;
  uVar62 = in2[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar62 * 0x13;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar61;
  uVar60 = in2[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar60 * 0x13;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar61;
  uVar63 = in1[3];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar63;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar3;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar63;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar63;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar62 * 0x13;
  uVar1 = in1[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar1;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar2;
  uVar2 = in1[1];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar3;
  uVar3 = *in2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar3;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar61;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar63;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar60;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar3;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar63;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar62;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar60;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar3;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar2;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar59;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar2;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar62;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar2;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar60;
  uVar61 = *in1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar3;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar61;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = in2[4];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar61;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar59;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar61;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar62;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar61;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar60;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar61;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar3;
  auVar7 = auVar28 * auVar53 +
           auVar13 * auVar38 + auVar12 * auVar37 + auVar7 * auVar32 + auVar10 * auVar35;
  uVar61 = auVar7._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = auVar7._8_8_ << 0xd | uVar61 >> 0x33;
  auVar54 = auVar27 * auVar52 +
            auVar11 * auVar36 + auVar6 * auVar31 + auVar9 * auVar34 + auVar23 * auVar48 + auVar54;
  uVar62 = auVar54._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = auVar54._8_8_ << 0xd | uVar62 >> 0x33;
  auVar55 = auVar26 * auVar51 +
            auVar19 * auVar44 + auVar22 * auVar47 + auVar5 * auVar30 + auVar8 * auVar33 + auVar55;
  uVar59 = auVar55._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar55._8_8_ * 0x2000 | uVar59 >> 0x33;
  auVar56 = auVar25 * auVar50 +
            auVar18 * auVar43 + auVar4 * auVar29 + auVar21 * auVar46 + auVar16 * auVar41 + auVar56;
  uVar63 = auVar56._0_8_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = auVar56._8_8_ * 0x2000 | uVar63 >> 0x33;
  auVar57 = auVar24 * auVar49 +
            auVar17 * auVar42 + auVar15 * auVar40 + auVar20 * auVar45 + auVar14 * auVar39 + auVar57;
  uVar60 = auVar57._0_8_;
  uVar61 = (auVar57._8_8_ * 0x2000 | uVar60 >> 0x33) * 0x13 + (uVar61 & 0x7ffffffffffff);
  uVar62 = (uVar61 >> 0x33) + (uVar62 & 0x7ffffffffffff);
  *out = uVar61 & 0x7ffffffffffff;
  out[1] = uVar62 & 0x7ffffffffffff;
  out[2] = (uVar62 >> 0x33) + (uVar59 & 0x7ffffffffffff);
  out[3] = uVar63 & 0x7ffffffffffff;
  out[4] = uVar60 & 0x7ffffffffffff;
  lVar58 = 0;
  do {
    if (0x8cccccccccccc < out[lVar58]) {
      __assert_fail("constant_time_declassify_int(out[_assert_fe_i] <= 0x8ccccccccccccUL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xd8,"void fe_mul_impl(fe_limb_t *, const fe_limb_t *, const fe_limb_t *)");
    }
    lVar58 = lVar58 + 1;
  } while (lVar58 != 5);
  return;
}

Assistant:

static void fe_mul_impl(fe_limb_t out[FE_NUM_LIMBS],
                        const fe_limb_t in1[FE_NUM_LIMBS],
                        const fe_limb_t in2[FE_NUM_LIMBS]) {
  assert_fe_loose(in1);
  assert_fe_loose(in2);
  fiat_25519_carry_mul(out, in1, in2);
  assert_fe(out);
}